

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlif.c
# Opt level: O0

int Io_ReadBlifNetworkConnectBoxesOneBox(Io_ReadBlif_t *p,Abc_Obj_t *pBox,stmm_table *tName2Model)

{
  int iVar1;
  int iVar2;
  char *key;
  void *pvVar3;
  Abc_Obj_t *pAVar4;
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar5;
  int local_64;
  int Start;
  int Length;
  int i;
  char *pActual;
  char *pName;
  Abc_Obj_t *pNet;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtkModel;
  Vec_Ptr_t *pNames;
  stmm_table *tName2Model_local;
  Abc_Obj_t *pBox_local;
  Io_ReadBlif_t *p_local;
  
  pActual = (char *)0x0;
  local_64 = -1;
  pNtkModel = (Abc_Ntk_t *)(pBox->field_5).pData;
  pNames = (Vec_Ptr_t *)tName2Model;
  tName2Model_local = (stmm_table *)pBox;
  pBox_local = (Abc_Obj_t *)p;
  key = (char *)Vec_PtrEntry((Vec_Ptr_t *)pNtkModel,0);
  iVar1 = stmm_lookup(tName2Model,key,(char **)&pObj);
  if (iVar1 == 0) {
    *(int *)&(pBox_local->vFanins).pArray = (int)tName2Model_local[1].hash;
    pAVar4 = pBox_local + 2;
    pvVar3 = Vec_PtrEntry((Vec_Ptr_t *)pNtkModel,0);
    sprintf((char *)&pAVar4->pNext,"Cannot find the model for subcircuit %s.",pvVar3);
    Io_ReadBlifPrintErrorMessage((Io_ReadBlif_t *)pBox_local);
    p_local._4_4_ = 1;
  }
  else {
    for (Start = 0; iVar1 = Abc_NtkPiNum((Abc_Ntk_t *)pObj), Start < iVar1; Start = Start + 1) {
      pAVar4 = Abc_NtkPi((Abc_Ntk_t *)pObj,Start);
      (pAVar4->field_6).pTemp = (void *)0x0;
    }
    iVar1 = Abc_NtkPiNum((Abc_Ntk_t *)pObj);
    if (iVar1 == 0) {
      local_64 = 1;
    }
    else {
      for (Start = 1; iVar1 = Vec_PtrSize((Vec_Ptr_t *)pNtkModel), Start < iVar1; Start = Start + 1)
      {
        pActual = (char *)Vec_PtrEntry((Vec_Ptr_t *)pNtkModel,Start);
        aVar5.pTemp = Io_ReadBlifCleanName(pActual);
        if ((char *)aVar5.pTemp == (char *)0x0) {
          *(int *)&(pBox_local->vFanins).pArray = (int)tName2Model_local[1].hash;
          sprintf((char *)&pBox_local[2].pNext,"Cannot parse formal/actual name pair \"%s\".",
                  pActual);
          Io_ReadBlifPrintErrorMessage((Io_ReadBlif_t *)pBox_local);
          return 1;
        }
        iVar1 = (aVar5.iTemp - (int)pActual) + -1;
        pActual[iVar1] = '\0';
        pAVar4 = Abc_NtkFindNet((Abc_Ntk_t *)pObj,pActual);
        if (pAVar4 == (Abc_Obj_t *)0x0) {
          *(int *)&(pBox_local->vFanins).pArray = (int)tName2Model_local[1].hash;
          pAVar4 = pBox_local + 2;
          pvVar3 = Vec_PtrEntry((Vec_Ptr_t *)pNtkModel,0);
          sprintf((char *)&pAVar4->pNext,"Cannot find formal input \"%s\" as an PI of model \"%s\"."
                  ,pActual,pvVar3);
          Io_ReadBlifPrintErrorMessage((Io_ReadBlif_t *)pBox_local);
          return 1;
        }
        pAVar4 = Abc_ObjFanin0(pAVar4);
        iVar2 = Abc_ObjIsPi(pAVar4);
        if (iVar2 == 0) {
          pActual[iVar1] = '=';
          local_64 = Start;
          break;
        }
        if ((pAVar4->field_6).pTemp != (void *)0x0) {
          *(int *)&(pBox_local->vFanins).pArray = (int)tName2Model_local[1].hash;
          sprintf((char *)&pBox_local[2].pNext,"Formal input \"%s\" is used more than once.",pActual
                 );
          Io_ReadBlifPrintErrorMessage((Io_ReadBlif_t *)pBox_local);
          return 1;
        }
        pAVar4->field_6 = aVar5;
        iVar1 = Abc_NtkPiNum((Abc_Ntk_t *)pObj);
        if (Start == iVar1) {
          local_64 = Start + 1;
          break;
        }
      }
    }
    for (Start = 0; iVar1 = Abc_NtkPiNum((Abc_Ntk_t *)pObj), Start < iVar1; Start = Start + 1) {
      pAVar4 = Abc_NtkPi((Abc_Ntk_t *)pObj,Start);
      if ((char *)(pAVar4->field_6).pTemp == (char *)0x0) {
        *(int *)&(pBox_local->vFanins).pArray = (int)tName2Model_local[1].hash;
        pAVar4 = pBox_local + 2;
        pvVar3 = Vec_PtrEntry((Vec_Ptr_t *)pNtkModel,0);
        sprintf((char *)&pAVar4->pNext,"Formal input \"%s\" of model %s is not driven.",pActual,
                pvVar3);
        Io_ReadBlifPrintErrorMessage((Io_ReadBlif_t *)pBox_local);
        return 1;
      }
      pAVar4 = Abc_NtkFindOrCreateNet
                         ((Abc_Ntk_t *)tName2Model_local->compare,(char *)(pAVar4->field_6).pTemp);
      Abc_ObjAddFanin((Abc_Obj_t *)tName2Model_local,pAVar4);
    }
    for (Start = 0; iVar1 = Abc_NtkPiNum((Abc_Ntk_t *)pObj), Start < iVar1; Start = Start + 1) {
      pAVar4 = Abc_NtkPi((Abc_Ntk_t *)pObj,Start);
      (pAVar4->field_6).pTemp = (void *)0x0;
    }
    for (Start = 0; iVar1 = Abc_NtkPoNum((Abc_Ntk_t *)pObj), Start < iVar1; Start = Start + 1) {
      pAVar4 = Abc_NtkPo((Abc_Ntk_t *)pObj,Start);
      (pAVar4->field_6).pTemp = (void *)0x0;
    }
    for (Start = local_64; iVar1 = Vec_PtrSize((Vec_Ptr_t *)pNtkModel), Start < iVar1;
        Start = Start + 1) {
      pActual = (char *)Vec_PtrEntry((Vec_Ptr_t *)pNtkModel,Start);
      aVar5.pTemp = Io_ReadBlifCleanName(pActual);
      if ((char *)aVar5.pTemp == (char *)0x0) {
        *(int *)&(pBox_local->vFanins).pArray = (int)tName2Model_local[1].hash;
        sprintf((char *)&pBox_local[2].pNext,"Cannot parse formal/actual name pair \"%s\".",pActual)
        ;
        Io_ReadBlifPrintErrorMessage((Io_ReadBlif_t *)pBox_local);
        return 1;
      }
      pActual[(aVar5.iTemp - (int)pActual) + -1] = '\0';
      pAVar4 = Abc_NtkFindNet((Abc_Ntk_t *)pObj,pActual);
      if (pAVar4 == (Abc_Obj_t *)0x0) {
        *(int *)&(pBox_local->vFanins).pArray = (int)tName2Model_local[1].hash;
        pAVar4 = pBox_local + 2;
        pvVar3 = Vec_PtrEntry((Vec_Ptr_t *)pNtkModel,0);
        sprintf((char *)&pAVar4->pNext,"Cannot find formal output \"%s\" as an PO of model \"%s\".",
                pActual,pvVar3);
        Io_ReadBlifPrintErrorMessage((Io_ReadBlif_t *)pBox_local);
        return 1;
      }
      pAVar4 = Abc_ObjFanout0(pAVar4);
      if ((pAVar4->field_6).pTemp != (void *)0x0) {
        *(int *)&(pBox_local->vFanins).pArray = (int)tName2Model_local[1].hash;
        sprintf((char *)&pBox_local[2].pNext,"Formal output \"%s\" is used more than once.",pActual)
        ;
        Io_ReadBlifPrintErrorMessage((Io_ReadBlif_t *)pBox_local);
        return 1;
      }
      pAVar4->field_6 = aVar5;
    }
    for (Start = 0; iVar1 = Abc_NtkPoNum((Abc_Ntk_t *)pObj), Start < iVar1; Start = Start + 1) {
      pAVar4 = Abc_NtkPo((Abc_Ntk_t *)pObj,Start);
      if ((char *)(pAVar4->field_6).pTemp == (char *)0x0) {
        *(int *)&(pBox_local->vFanins).pArray = (int)tName2Model_local[1].hash;
        pAVar4 = pBox_local + 2;
        pvVar3 = Vec_PtrEntry((Vec_Ptr_t *)pNtkModel,0);
        sprintf((char *)&pAVar4->pNext,"Formal output \"%s\" of model %s is not driven.",pActual,
                pvVar3);
        Io_ReadBlifPrintErrorMessage((Io_ReadBlif_t *)pBox_local);
        return 1;
      }
      pAVar4 = Abc_NtkFindOrCreateNet
                         ((Abc_Ntk_t *)tName2Model_local->compare,(char *)(pAVar4->field_6).pTemp);
      Abc_ObjAddFanin(pAVar4,(Abc_Obj_t *)tName2Model_local);
    }
    for (Start = 0; iVar1 = Abc_NtkPoNum((Abc_Ntk_t *)pObj), Start < iVar1; Start = Start + 1) {
      pAVar4 = Abc_NtkPo((Abc_Ntk_t *)pObj,Start);
      (pAVar4->field_6).pTemp = (void *)0x0;
    }
    for (Start = 0; iVar1 = Vec_PtrSize((Vec_Ptr_t *)tName2Model_local[1].compare), Start < iVar1;
        Start = Start + 1) {
      pvVar3 = Vec_PtrEntry((Vec_Ptr_t *)tName2Model_local[1].compare,Start);
      if (pvVar3 != (void *)0x0) {
        free(pvVar3);
      }
    }
    Vec_PtrFree((Vec_Ptr_t *)tName2Model_local[1].compare);
    tName2Model_local[1].compare = (stmm_compare_func_type)pObj;
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

int Io_ReadBlifNetworkConnectBoxesOneBox( Io_ReadBlif_t * p, Abc_Obj_t * pBox, stmm_table * tName2Model )
{
    Vec_Ptr_t * pNames;
    Abc_Ntk_t * pNtkModel;
    Abc_Obj_t * pObj, * pNet;
    char * pName = NULL, * pActual;
    int i, Length, Start = -1;

    // get the model for this box
    pNames = (Vec_Ptr_t *)pBox->pData;
    if ( !stmm_lookup( tName2Model, (char *)Vec_PtrEntry(pNames, 0), (char **)&pNtkModel ) )
    {
        p->LineCur = (int)(ABC_PTRINT_T)pBox->pCopy;
        sprintf( p->sError, "Cannot find the model for subcircuit %s.", (char*)Vec_PtrEntry(pNames, 0) );
        Io_ReadBlifPrintErrorMessage( p );
        return 1;
    }

    // create the fanins of the box
    Abc_NtkForEachPi( pNtkModel, pObj, i )
        pObj->pCopy = NULL;
    if ( Abc_NtkPiNum(pNtkModel) == 0 )
        Start = 1;
    else
    {
        Vec_PtrForEachEntryStart( char *, pNames, pName, i, 1 )
        {
            pActual = Io_ReadBlifCleanName(pName);
            if ( pActual == NULL )
            {
                p->LineCur = (int)(ABC_PTRINT_T)pBox->pCopy;
                sprintf( p->sError, "Cannot parse formal/actual name pair \"%s\".", pName );
                Io_ReadBlifPrintErrorMessage( p );
                return 1;
            }
            Length = pActual - pName - 1;
            pName[Length] = 0;
            // find the PI net with this name
            pObj = Abc_NtkFindNet( pNtkModel, pName );
            if ( pObj == NULL )
            {
                p->LineCur = (int)(ABC_PTRINT_T)pBox->pCopy;
                sprintf( p->sError, "Cannot find formal input \"%s\" as an PI of model \"%s\".", pName, (char*)Vec_PtrEntry(pNames, 0) );
                Io_ReadBlifPrintErrorMessage( p );
                return 1;
            }
            // get the PI
            pObj = Abc_ObjFanin0(pObj);
            // quit if this is not a PI net
            if ( !Abc_ObjIsPi(pObj) )
            {
                pName[Length] = '=';
                Start = i;
                break;
            }
            // remember the actual name in the net
            if ( pObj->pCopy != NULL )
            {
                p->LineCur = (int)(ABC_PTRINT_T)pBox->pCopy;
                sprintf( p->sError, "Formal input \"%s\" is used more than once.", pName );
                Io_ReadBlifPrintErrorMessage( p );
                return 1;
            }
            pObj->pCopy = (Abc_Obj_t *)pActual;
            // quit if we processed all PIs
            if ( i == Abc_NtkPiNum(pNtkModel) )
            {
                Start = i+1;
                break;
            }
        }
    }
    // create the fanins of the box
    Abc_NtkForEachPi( pNtkModel, pObj, i )
    {
        pActual = (char *)pObj->pCopy;
        if ( pActual == NULL )
        {
            p->LineCur = (int)(ABC_PTRINT_T)pBox->pCopy;
            sprintf( p->sError, "Formal input \"%s\" of model %s is not driven.", pName, (char*)Vec_PtrEntry(pNames, 0) );
            Io_ReadBlifPrintErrorMessage( p );
            return 1;
        }
        pNet = Abc_NtkFindOrCreateNet( pBox->pNtk, pActual );
        Abc_ObjAddFanin( pBox, pNet );
    }
    Abc_NtkForEachPi( pNtkModel, pObj, i )
        pObj->pCopy = NULL;

    // create the fanouts of the box
    Abc_NtkForEachPo( pNtkModel, pObj, i )
        pObj->pCopy = NULL;
    Vec_PtrForEachEntryStart( char *, pNames, pName, i, Start )
    {
        pActual = Io_ReadBlifCleanName(pName);
        if ( pActual == NULL )
        {
            p->LineCur = (int)(ABC_PTRINT_T)pBox->pCopy;
            sprintf( p->sError, "Cannot parse formal/actual name pair \"%s\".", pName );
            Io_ReadBlifPrintErrorMessage( p );
            return 1;
        }
        Length = pActual - pName - 1;
        pName[Length] = 0;
        // find the PO net with this name
        pObj = Abc_NtkFindNet( pNtkModel, pName );
        if ( pObj == NULL )
        {
            p->LineCur = (int)(ABC_PTRINT_T)pBox->pCopy;
            sprintf( p->sError, "Cannot find formal output \"%s\" as an PO of model \"%s\".", pName, (char*)Vec_PtrEntry(pNames, 0) );
            Io_ReadBlifPrintErrorMessage( p );
            return 1;
        }
        // get the PO
        pObj = Abc_ObjFanout0(pObj);
        if ( pObj->pCopy != NULL )
        {
            p->LineCur = (int)(ABC_PTRINT_T)pBox->pCopy;
            sprintf( p->sError, "Formal output \"%s\" is used more than once.", pName );
            Io_ReadBlifPrintErrorMessage( p );
            return 1;
        }
        pObj->pCopy = (Abc_Obj_t *)pActual;
    }
    // create the fanouts of the box
    Abc_NtkForEachPo( pNtkModel, pObj, i )
    {
        pActual = (char *)pObj->pCopy;
        if ( pActual == NULL )
        {
            p->LineCur = (int)(ABC_PTRINT_T)pBox->pCopy;
            sprintf( p->sError, "Formal output \"%s\" of model %s is not driven.", pName, (char*)Vec_PtrEntry(pNames, 0) );
            Io_ReadBlifPrintErrorMessage( p );
            return 1;
        }
        pNet = Abc_NtkFindOrCreateNet( pBox->pNtk, pActual );
        Abc_ObjAddFanin( pNet, pBox );
    }
    Abc_NtkForEachPo( pNtkModel, pObj, i )
        pObj->pCopy = NULL;

    // remove the array of names, assign the pointer to the model
    Vec_PtrForEachEntry( char *, (Vec_Ptr_t *)pBox->pData, pName, i )
        ABC_FREE( pName );
    Vec_PtrFree( (Vec_Ptr_t *)pBox->pData );
    pBox->pData = pNtkModel;
    return 0;
}